

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvastrscan.c
# Opt level: O0

void strwait(void)

{
  uint32_t uVar1;
  bool bVar2;
  int local_c;
  int ctr;
  
  local_c = 0;
  while( true ) {
    uVar1 = nva_rd32(cnum,0x400404);
    bVar2 = true;
    if ((uVar1 & 0x20000) == 0) {
      uVar1 = nva_rd32(cnum,0x400400);
      bVar2 = true;
      if (uVar1 == 0) {
        uVar1 = nva_rd32(cnum,0x400700);
        bVar2 = true;
        if ((uVar1 & 0x100) == 0) {
          uVar1 = nva_rd32(cnum,0x800);
          bVar2 = uVar1 != 0;
        }
      }
    }
    if (!bVar2) break;
    local_c = local_c + 1;
    if (0x1000000 < local_c) {
      printf("Aiiii, xfer is hung. bailing.\n");
      exit(1);
    }
  }
  do {
    uVar1 = nva_rd32(cnum,0x400404);
    bVar2 = true;
    if ((uVar1 & 0x20000) == 0) {
      uVar1 = nva_rd32(cnum,0x400400);
      bVar2 = true;
      if (uVar1 == 0) {
        uVar1 = nva_rd32(cnum,0x400700);
        bVar2 = true;
        if ((uVar1 & 0x100) == 0) {
          uVar1 = nva_rd32(cnum,0x800);
          bVar2 = uVar1 != 0;
        }
      }
    }
  } while (bVar2);
  return;
}

Assistant:

void strwait() {
	int ctr = 0;
	while (nva_rd32(cnum, 0x400404) & 0x20000 || nva_rd32(cnum, 0x400400) || nva_rd32(cnum, 0x400700) & 0x100 || nva_rd32(cnum, 0x40082c & 0x800)) {
		ctr++;
		if (ctr > 0x1000000) {
			printf("Aiiii, xfer is hung. bailing.\n");
			exit(1);
		}
	}
	while (nva_rd32(cnum, 0x400404) & 0x20000 || nva_rd32(cnum, 0x400400) || nva_rd32(cnum, 0x400700) & 0x100 || nva_rd32(cnum, 0x40082c & 0x800));
}